

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void serialize_combined(IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,
                       TreesIndexer *indexer,char *optional_metadata,size_t size_optional_metadata,
                       ostream *out)

{
  pointer pSVar1;
  IsoForest *model_00;
  size_t sVar2;
  runtime_error *this;
  size_t sVar3;
  pointer node;
  undefined1 auVar4 [16];
  undefined1 uStack_7a;
  undefined1 uStack_79;
  size_t sStack_78;
  size_t sStack_70;
  SignalSwitcher SStack_68;
  char *pcStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  IsoForest *pIStack_40;
  undefined8 uStack_38;
  
  sStack_78 = size_optional_metadata;
  pcStack_58 = optional_metadata;
  SignalSwitcher::SignalSwitcher(&SStack_68);
  auVar4 = std::ostream::tellp();
  uStack_50 = auVar4._8_8_;
  uStack_48 = auVar4._0_8_;
  add_setup_info<std::ostream>(out,false);
  uStack_7a = 4;
  write_bytes<unsigned_char>(&uStack_7a,1,out);
  if (model == (IsoForest *)0x0) {
    if (model_ext == (ExtIsoForest *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Must pass one of \'model\' or \'model_ext\'.\n");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (sStack_78 == 0) {
      if (imputer == (Imputer *)0x0) {
        if (indexer == (TreesIndexer *)0x0) {
          uStack_7a = 2;
        }
        else {
          uStack_7a = 0xe;
        }
      }
      else if (indexer == (TreesIndexer *)0x0) {
        uStack_7a = 5;
      }
      else {
        uStack_7a = 0xf;
      }
    }
    else if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        uStack_7a = 7;
      }
      else {
        uStack_7a = 0x11;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      uStack_7a = 9;
    }
    else {
      uStack_7a = 0x13;
    }
  }
  else if (sStack_78 == 0) {
    if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        uStack_7a = 1;
      }
      else {
        uStack_7a = 0xc;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      uStack_7a = 4;
    }
    else {
      uStack_7a = 0xd;
    }
  }
  else if (imputer == (Imputer *)0x0) {
    if (indexer == (TreesIndexer *)0x0) {
      uStack_7a = 6;
    }
    else {
      uStack_7a = 0x10;
    }
  }
  else if (indexer == (TreesIndexer *)0x0) {
    uStack_7a = 8;
  }
  else {
    uStack_7a = 0x12;
  }
  write_bytes<unsigned_char>(&uStack_7a,1,out);
  if (model == (IsoForest *)0x0) {
    sStack_70 = get_size_model(model_ext);
  }
  else {
    sStack_70 = get_size_model(model);
  }
  write_bytes<unsigned_long>(&sStack_70,1,out);
  if (imputer == (Imputer *)0x0) {
    sStack_70 = 0;
  }
  else {
    sStack_70 = get_size_model(imputer);
  }
  write_bytes<unsigned_long>(&sStack_70,1,out);
  pIStack_40 = model;
  if (indexer == (TreesIndexer *)0x0) {
    sVar3 = 0;
  }
  else {
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar3 = 8;
    for (node = (indexer->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_start; node != pSVar1; node = node + 1) {
      sVar2 = get_size_node(node);
      sVar3 = sVar3 + sVar2;
    }
  }
  sStack_70 = sVar3;
  write_bytes<unsigned_long>(&sStack_70,1,out);
  model_00 = pIStack_40;
  write_bytes<unsigned_long>(&sStack_78,1,out);
  check_interrupt_switch(&SStack_68);
  if (model_00 == (IsoForest *)0x0) {
    serialize_model<std::ostream>(model_ext,out);
  }
  else {
    serialize_model<std::ostream>(model_00,out);
  }
  if (imputer != (Imputer *)0x0) {
    serialize_model<std::ostream>(imputer,out);
  }
  if (indexer != (TreesIndexer *)0x0) {
    serialize_model<std::ostream>(indexer,out);
  }
  if (sStack_78 != 0) {
    write_bytes<char>(pcStack_58,sStack_78,out);
  }
  check_interrupt_switch(&SStack_68);
  uStack_79 = 0;
  write_bytes<unsigned_char>(&uStack_79,1,out);
  uStack_38 = 0;
  write_bytes<unsigned_long>(&uStack_38,1,out);
  auVar4 = std::ostream::tellp();
  std::ostream::seekp(out,uStack_48,uStack_50);
  write_bytes<unsigned_char>(watermark,0xd,out);
  std::ostream::seekp(out,auVar4._0_8_,auVar4._8_8_);
  SignalSwitcher::~SignalSwitcher(&SStack_68);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    std::ostream &out
)
{
    serialize_combined<std::ostream>(
        model,
        model_ext,
        imputer,
        indexer,
        optional_metadata,
        size_optional_metadata,
        out
    );
}